

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::ComplexTypeInfo::getFormattedContentModel(ComplexTypeInfo *this)

{
  XMLCh *pXVar1;
  ComplexTypeInfo *this_local;
  
  if (this->fFormattedModel == (XMLCh *)0x0) {
    pXVar1 = formatContentModel(this);
    this->fFormattedModel = pXVar1;
  }
  return this->fFormattedModel;
}

Assistant:

const XMLCh*
ComplexTypeInfo::getFormattedContentModel() const
{
    //
    //  If its not already built, then call the protected virtual method
    //  to allow the derived class to build it (since only it knows.)
    //  Otherwise, just return the previously formatted methods.
    //
    //  Since we are faulting this in, within a const getter, we have to
    //  cast off the const-ness.
    //
    if (!fFormattedModel)
        ((ComplexTypeInfo*)this)->fFormattedModel = formatContentModel();

    return fFormattedModel;
}